

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Expression * __thiscall
wasm::Builder::replaceWithIdenticalType<wasm::Block>(Builder *this,Block *curr)

{
  bool bVar1;
  Shareability share;
  BasicType BVar2;
  Const *value_00;
  RefI31 *expr;
  Expression *pEVar3;
  pointer init;
  bool local_191;
  Literal local_168;
  undefined4 local_14c;
  Literal local_148;
  value_type_conflict1 local_129;
  undefined1 local_128 [8];
  array<unsigned_char,_16UL> bytes;
  Literal local_100;
  Literal local_e8;
  Literal local_d0;
  undefined1 local_b8 [8];
  Literal value;
  HeapType local_98;
  uintptr_t local_90;
  uintptr_t local_78;
  Literals local_70;
  undefined1 local_38 [8];
  anon_class_16_2_3fee0b3d maybeWrap;
  Type type;
  Block *curr_local;
  Builder *this_local;
  
  maybeWrap.this =
       (Builder *)(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
  ;
  local_38 = (undefined1  [8])&maybeWrap.this;
  maybeWrap.type = (Type *)this;
  bVar1 = wasm::Type::isTuple(&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                               super_Expression.type);
  if ((bVar1) &&
     (bVar1 = wasm::Type::isDefaultable
                        (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression
                          .type), bVar1)) {
    local_78 = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    wasm::Literal::makeZeros(&local_70,(Type)local_78);
    pEVar3 = makeConstantExpression(this,&local_70);
    pEVar3 = replaceWithIdenticalType<wasm::Block>::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_38,pEVar3);
    Literals::~Literals(&local_70);
    return pEVar3;
  }
  bVar1 = wasm::Type::isNullable
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                      type);
  if (bVar1) {
    local_90 = (uintptr_t)
               wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                           super_Expression.type);
    pEVar3 = (Expression *)ExpressionManipulator::refNull<wasm::Block>(curr,(HeapType)local_90);
    pEVar3 = replaceWithIdenticalType<wasm::Block>::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_38,pEVar3);
    return pEVar3;
  }
  bVar1 = wasm::Type::isRef(&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                             super_Expression.type);
  local_191 = false;
  if (bVar1) {
    local_98 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                           super_Expression.type);
    local_191 = HeapType::isMaybeShared(&local_98,i31);
  }
  if (local_191 != false) {
    value_00 = makeConst<int>(this,0);
    value.type.id =
         (uintptr_t)
         wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                   );
    share = HeapType::getShared((HeapType *)&value.type);
    expr = makeRefI31(this,(Expression *)value_00,share);
    pEVar3 = replaceWithIdenticalType<wasm::Block>::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_38,(Expression *)expr);
    return pEVar3;
  }
  bVar1 = wasm::Type::isBasic(&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).
                               super_Expression.type);
  if (!bVar1) {
    return (Expression *)curr;
  }
  wasm::Literal::Literal((Literal *)local_b8);
  BVar2 = wasm::Type::getBasic
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                      type);
  switch(BVar2) {
  case none:
    this_local = (Builder *)ExpressionManipulator::nop<wasm::Block>(curr);
    goto LAB_0230ca33;
  case unreachable:
    this_local = (Builder *)ExpressionManipulator::unreachable<wasm::Block>(curr);
    goto LAB_0230ca33;
  case i32:
    wasm::Literal::Literal(&local_d0,0);
    wasm::Literal::operator=((Literal *)local_b8,&local_d0);
    wasm::Literal::~Literal(&local_d0);
    break;
  case i64:
    wasm::Literal::Literal(&local_e8,0);
    wasm::Literal::operator=((Literal *)local_b8,&local_e8);
    wasm::Literal::~Literal(&local_e8);
    break;
  case f32:
    wasm::Literal::Literal(&local_100,0.0);
    wasm::Literal::operator=((Literal *)local_b8,&local_100);
    wasm::Literal::~Literal(&local_100);
    break;
  case f64:
    wasm::Literal::Literal((Literal *)(bytes._M_elems + 8),0.0);
    wasm::Literal::operator=((Literal *)local_b8,(Literal *)(bytes._M_elems + 8));
    wasm::Literal::~Literal((Literal *)(bytes._M_elems + 8));
    break;
  case v128:
    local_129 = '\0';
    std::array<unsigned_char,_16UL>::fill((array<unsigned_char,_16UL> *)local_128,&local_129);
    init = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_128);
    wasm::Literal::Literal(&local_148,init);
    wasm::Literal::operator=((Literal *)local_b8,&local_148);
    wasm::Literal::~Literal(&local_148);
  }
  wasm::Literal::Literal(&local_168,(Literal *)local_b8);
  this_local = (Builder *)makeConst(this,&local_168);
  wasm::Literal::~Literal(&local_168);
LAB_0230ca33:
  local_14c = 1;
  wasm::Literal::~Literal((Literal *)local_b8);
  return (Expression *)this_local;
}

Assistant:

Expression* replaceWithIdenticalType(T* curr) {
    auto type = curr->type;
    // Anything that would otherwise have a more refined type than the original
    // expression needs to be wrapped in a block with the original type.
    auto maybeWrap = [&](Expression* expr) -> Expression* {
      return expr->type == type ? expr : makeBlock({expr}, type);
    };
    if (curr->type.isTuple() && curr->type.isDefaultable()) {
      return maybeWrap(makeConstantExpression(Literal::makeZeros(curr->type)));
    }
    if (curr->type.isNullable()) {
      return maybeWrap(
        ExpressionManipulator::refNull(curr, curr->type.getHeapType()));
    }
    if (curr->type.isRef() &&
        curr->type.getHeapType().isMaybeShared(HeapType::i31)) {
      return maybeWrap(
        makeRefI31(makeConst(0), curr->type.getHeapType().getShared()));
    }
    if (!curr->type.isBasic()) {
      // We can't do any better, keep the original.
      return curr;
    }
    Literal value;
    // TODO: reuse node conditionally when possible for literals
    switch (curr->type.getBasic()) {
      case Type::i32:
        value = Literal(int32_t(0));
        break;
      case Type::i64:
        value = Literal(int64_t(0));
        break;
      case Type::f32:
        value = Literal(float(0));
        break;
      case Type::f64:
        value = Literal(double(0));
        break;
      case Type::v128: {
        std::array<uint8_t, 16> bytes;
        bytes.fill(0);
        value = Literal(bytes.data());
        break;
      }
      case Type::none:
        return ExpressionManipulator::nop(curr);
      case Type::unreachable:
        return ExpressionManipulator::unreachable(curr);
    }
    return makeConst(value);
  }